

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdNode.cpp
# Opt level: O0

KdNode * KdNode::build(vector<Triangle,_std::allocator<Triangle>_> *triangles,
                      vector<float,_std::allocator<float>_> *ranges,int depth)

{
  value_type vVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  reference tr;
  KdNode *pKVar5;
  int iVar6;
  float fVar7;
  Point PVar8;
  float tmp;
  float fStack_100;
  float fStack_e0;
  float local_c4;
  float local_94;
  Triangle *triangle;
  iterator __end1;
  iterator __begin1;
  vector<Triangle,_std::allocator<Triangle>_> *__range1;
  float midValue;
  int axis;
  vector<Triangle,_std::allocator<Triangle>_> rightTrs;
  vector<Triangle,_std::allocator<Triangle>_> leftTrs;
  KdNode *node;
  int depth_local;
  vector<float,_std::allocator<float>_> *ranges_local;
  vector<Triangle,_std::allocator<Triangle>_> *triangles_local;
  
  sVar3 = std::vector<Triangle,_std::allocator<Triangle>_>::size(triangles);
  if (sVar3 == 0) {
    triangles_local = (vector<Triangle,_std::allocator<Triangle>_> *)0x0;
  }
  else {
    triangles_local = (vector<Triangle,_std::allocator<Triangle>_> *)operator_new(0x30);
    memset(triangles_local,0,0x30);
    KdNode((KdNode *)triangles_local);
    sVar3 = std::vector<Triangle,_std::allocator<Triangle>_>::size(triangles);
    if ((sVar3 < 10) || (0x14 < depth)) {
      std::vector<Triangle,_std::allocator<Triangle>_>::operator=
                (&((KdNode *)triangles_local)->triangles,triangles);
    }
    else {
      std::vector<Triangle,_std::allocator<Triangle>_>::vector
                ((vector<Triangle,_std::allocator<Triangle>_> *)
                 &rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<Triangle,_std::allocator<Triangle>_>::vector
                ((vector<Triangle,_std::allocator<Triangle>_> *)&midValue);
      iVar6 = depth % 3;
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](ranges,(long)(iVar6 << 1));
      fVar7 = *pvVar4;
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](ranges,(long)(iVar6 * 2 + 1));
      fVar7 = (fVar7 + *pvVar4) / 2.0;
      __end1 = std::vector<Triangle,_std::allocator<Triangle>_>::begin(triangles);
      triangle = (Triangle *)std::vector<Triangle,_std::allocator<Triangle>_>::end(triangles);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<Triangle_*,_std::vector<Triangle,_std::allocator<Triangle>_>_>
                                         *)&triangle), bVar2) {
        tr = __gnu_cxx::
             __normal_iterator<Triangle_*,_std::vector<Triangle,_std::allocator<Triangle>_>_>::
             operator*(&__end1);
        if (iVar6 == 0) {
          PVar8 = getMinPoint(tr);
          local_94 = PVar8.x;
          if (local_94 <= fVar7) {
            std::vector<Triangle,_std::allocator<Triangle>_>::push_back
                      ((vector<Triangle,_std::allocator<Triangle>_> *)
                       &rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,tr);
          }
          PVar8 = getMaxPoint(tr);
          local_c4 = PVar8.x;
          if (fVar7 < local_c4) {
            std::vector<Triangle,_std::allocator<Triangle>_>::push_back
                      ((vector<Triangle,_std::allocator<Triangle>_> *)&midValue,tr);
          }
        }
        else if (iVar6 == 1) {
          PVar8 = getMinPoint(tr);
          fStack_e0 = PVar8.y;
          if (fStack_e0 <= fVar7) {
            std::vector<Triangle,_std::allocator<Triangle>_>::push_back
                      ((vector<Triangle,_std::allocator<Triangle>_> *)
                       &rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,tr);
          }
          PVar8 = getMaxPoint(tr);
          fStack_100 = PVar8.y;
          if (fVar7 < fStack_100) {
            std::vector<Triangle,_std::allocator<Triangle>_>::push_back
                      ((vector<Triangle,_std::allocator<Triangle>_> *)&midValue,tr);
          }
        }
        else if (iVar6 == 2) {
          PVar8 = getMinPoint(tr);
          if (PVar8.z <= fVar7) {
            std::vector<Triangle,_std::allocator<Triangle>_>::push_back
                      ((vector<Triangle,_std::allocator<Triangle>_> *)
                       &rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,tr);
          }
          PVar8 = getMaxPoint(tr);
          if (fVar7 < PVar8.z) {
            std::vector<Triangle,_std::allocator<Triangle>_>::push_back
                      ((vector<Triangle,_std::allocator<Triangle>_> *)&midValue,tr);
          }
        }
        __gnu_cxx::__normal_iterator<Triangle_*,_std::vector<Triangle,_std::allocator<Triangle>_>_>
        ::operator++(&__end1);
      }
      ((KdNode *)triangles_local)->plane = fVar7;
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](ranges,(long)(iVar6 * 2));
      vVar1 = *pvVar4;
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](ranges,(long)(iVar6 * 2));
      *pvVar4 = fVar7;
      pKVar5 = build((vector<Triangle,_std::allocator<Triangle>_> *)&midValue,ranges,depth + 1);
      ((KdNode *)triangles_local)->right = pKVar5;
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](ranges,(long)(iVar6 * 2));
      *pvVar4 = vVar1;
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](ranges,(long)(iVar6 * 2 + 1));
      vVar1 = *pvVar4;
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](ranges,(long)(iVar6 * 2 + 1));
      *pvVar4 = fVar7;
      pKVar5 = build((vector<Triangle,_std::allocator<Triangle>_> *)
                     &rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,ranges,depth + 1);
      ((KdNode *)triangles_local)->left = pKVar5;
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](ranges,(long)(iVar6 * 2 + 1));
      *pvVar4 = vVar1;
      std::vector<Triangle,_std::allocator<Triangle>_>::~vector
                ((vector<Triangle,_std::allocator<Triangle>_> *)&midValue);
      std::vector<Triangle,_std::allocator<Triangle>_>::~vector
                ((vector<Triangle,_std::allocator<Triangle>_> *)
                 &rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
  }
  return (KdNode *)triangles_local;
}

Assistant:

KdNode* KdNode::build(std::vector<Triangle>& triangles, std::vector<float> &ranges, int depth)
{
  if (triangles.size() == 0)
    return nullptr;

  KdNode* node = new KdNode();

  if (triangles.size() < 10 || depth > 20)
  {
    node->triangles = triangles;
    return node;
  }

  std::vector<Triangle> leftTrs;
  std::vector<Triangle> rightTrs;

  int axis = depth % 3;

  float midValue = (ranges[axis*2] + ranges[axis*2+1]) / 2;
  for (auto const& triangle : triangles)
  {
    switch (axis)
    {
      case 0:
        if(getMinPoint(triangle).x <= midValue)
            leftTrs.push_back(triangle);
        if(getMaxPoint(triangle).x > midValue)
            rightTrs.push_back(triangle);
        break;
      case 1:
        if(getMinPoint(triangle).y <= midValue)
            leftTrs.push_back(triangle);
        if(getMaxPoint(triangle).y > midValue)
            rightTrs.push_back(triangle);
        break;
      case 2:
        if(getMinPoint(triangle).z <= midValue)
            leftTrs.push_back(triangle);
        if(getMaxPoint(triangle).z > midValue)
            rightTrs.push_back(triangle);
        break;
    }
  }

  node->plane = midValue;

  float tmp = ranges[axis*2];
  ranges[axis*2] = midValue;
  node->right = KdNode::build(rightTrs, ranges, depth+1);
  ranges[axis*2] = tmp;
  tmp = ranges[axis*2+1];
  ranges[axis*2+1] = midValue;
  node->left = KdNode::build(leftTrs, ranges, depth+1);
  ranges[axis*2+1] = tmp;

  return node;
}